

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddVarGroupCheck(DdManager *table,int x,int y)

{
  int index;
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = table->invperm[x];
  index = table->invperm[y];
  iVar1 = Cudd_bddIsVarToBeUngrouped(table,iVar3);
  iVar2 = 0;
  if ((iVar1 == 0) && (iVar1 = Cudd_bddReadPairIndex(table,iVar3), iVar1 == index)) {
    iVar2 = ddIsVarHandled(table,iVar3);
    if ((iVar2 == 0) && (iVar2 = ddIsVarHandled(table,index), iVar2 == 0)) {
      return 0;
    }
    iVar3 = Cudd_bddIsVarToBeGrouped(table,iVar3);
    if ((iVar3 == 0) && (iVar3 = Cudd_bddIsVarToBeGrouped(table,index), iVar3 == 0)) {
      return 0;
    }
    iVar2 = 0;
    if (table->keys - table->isolated <= originalSize) {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int
ddVarGroupCheck(
  DdManager * table,
  int x,
  int y)
{
    int xindex = table->invperm[x];
    int yindex = table->invperm[y];

    if (Cudd_bddIsVarToBeUngrouped(table, xindex)) return(0);

    if (Cudd_bddReadPairIndex(table, xindex) == yindex) {
        if (ddIsVarHandled(table, xindex) ||
            ddIsVarHandled(table, yindex)) {
            if (Cudd_bddIsVarToBeGrouped(table, xindex) ||
                Cudd_bddIsVarToBeGrouped(table, yindex) ) {
                if (table->keys - table->isolated <= originalSize) {
                    return(1);
                }
            }
        }
    }

    return(0);

}